

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_channels.cpp
# Opt level: O3

void __thiscall ON_RenderChannels::SetMode(ON_RenderChannels *this,Modes m)

{
  ON_InternalXMLImpl *this_00;
  ON_wString s;
  ON_wString local_110;
  ON_XMLVariant local_108;
  
  ON_wString::ON_wString(&local_110,L"automatic");
  if (m == Custom) {
    ON_wString::operator=(&local_110,L"custom");
  }
  this_00 = &this->m_impl->super_ON_InternalXMLImpl;
  ::ON_XMLVariant::ON_XMLVariant(&local_108,&local_110);
  ON_InternalXMLImpl::SetParameter
            (this_00,L"render-content-manager-document/settings/rendering/render-channels",L"mode",
             &local_108);
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  ON_wString::~ON_wString(&local_110);
  return;
}

Assistant:

void ON_RenderChannels::SetMode(Modes m)
{
  ON_wString s = ON_RDK_RCH_MODE_AUTOMATIC;
  if (Modes::Custom == m)
    s = ON_RDK_RCH_MODE_CUSTOM;

  m_impl->SetParameter(XMLPath(), ON_RDK_RCH_MODE, s);
}